

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_ownership(archive_write_disk *a)

{
  int iVar1;
  int *piVar2;
  archive_write_disk *a_local;
  
  if ((a->user_uid == 0) || (a->user_uid == a->uid)) {
    if ((L'\xffffffff' < a->fd) &&
       (iVar1 = fchown(a->fd,(__uid_t)a->uid,(__gid_t)a->gid), iVar1 == 0)) {
      a->todo = a->todo & 0xf5fffffe;
      return L'\0';
    }
    iVar1 = lchown(a->name,(__uid_t)a->uid,(__gid_t)a->gid);
    if (iVar1 == 0) {
      a->todo = a->todo & 0xf5fffffe;
      a_local._4_4_ = L'\0';
    }
    else {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"Can\'t set user=%jd/group=%jd for %s",a->uid,a->gid,
                        a->name);
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"Can\'t set UID=%jd",a->uid);
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
set_ownership(struct archive_write_disk *a)
{
#ifndef __CYGWIN__
/* unfortunately, on win32 there is no 'root' user with uid 0,
   so we just have to try the chown and see if it works */

	/* If we know we can't change it, don't bother trying. */
	if (a->user_uid != 0  &&  a->user_uid != a->uid) {
		archive_set_error(&a->archive, errno,
		    "Can't set UID=%jd", (intmax_t)a->uid);
		return (ARCHIVE_WARN);
	}
#endif

#ifdef HAVE_FCHOWN
	/* If we have an fd, we can avoid a race. */
	if (a->fd >= 0 && fchown(a->fd, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#endif

	/* We prefer lchown() but will use chown() if that's all we have. */
	/* Of course, if we have neither, this will always fail. */
#ifdef HAVE_LCHOWN
	if (lchown(a->name, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#elif HAVE_CHOWN
	if (!S_ISLNK(a->mode) && chown(a->name, a->uid, a->gid) == 0) {
		/* We've set owner and know uid/gid are correct. */
		a->todo &= ~(TODO_OWNER | TODO_SGID_CHECK | TODO_SUID_CHECK);
		return (ARCHIVE_OK);
	}
#endif

	archive_set_error(&a->archive, errno,
	    "Can't set user=%jd/group=%jd for %s",
	    (intmax_t)a->uid, (intmax_t)a->gid, a->name);
	return (ARCHIVE_WARN);
}